

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

uint __thiscall TxConfirmStats::NewTx(TxConfirmStats *this,uint nBlockHeight,double val)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  pointer pvVar4;
  bool bVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var7 = &(this->bucketMap->_M_t)._M_impl.super__Rb_tree_header._M_header;
  for (p_Var8 = (this->bucketMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar6 && bVar5]) {
    bVar5 = val != *(double *)(p_Var8 + 1);
    bVar6 = *(double *)(p_Var8 + 1) <= val;
    if (!bVar6 || !bVar5) {
      p_Var7 = p_Var8;
    }
  }
  uVar2 = *(uint *)&p_Var7[1]._M_parent;
  pvVar4 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar1 = (int *)(*(long *)&pvVar4[(ulong)nBlockHeight %
                                    (ulong)(((long)(this->unconfTxs).
                                                                                                      
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pvVar4 >> 3) * -0x5555555555555555)].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)uVar2 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int TxConfirmStats::NewTx(unsigned int nBlockHeight, double val)
{
    unsigned int bucketindex = bucketMap.lower_bound(val)->second;
    unsigned int blockIndex = nBlockHeight % unconfTxs.size();
    unconfTxs[blockIndex][bucketindex]++;
    return bucketindex;
}